

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O2

void parseGBCFile(filebuf *file)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  char buf [8];
  array<Rgba,_4UL> local_40;
  
  if (options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    options.palSpec.
    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         options.palSpec.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  while( true ) {
    lVar1 = (**(code **)(*(long *)file + 0x40))(file,buf,8);
    if (lVar1 != 8) break;
    local_40._M_elems[0] = Rgba::fromCGBColor(buf._0_2_);
    local_40._M_elems[1] = Rgba::fromCGBColor(buf._2_2_);
    local_40._M_elems[2] = Rgba::fromCGBColor(buf._4_2_);
    local_40._M_elems[3] = Rgba::fromCGBColor(buf._6_2_);
    std::vector<std::array<Rgba,4ul>,std::allocator<std::array<Rgba,4ul>>>::
    emplace_back<std::array<Rgba,4ul>>
              ((vector<std::array<Rgba,4ul>,std::allocator<std::array<Rgba,4ul>>> *)&options.palSpec
               ,&local_40);
  }
  if (lVar1 != 0) {
    pcVar3 = "s";
    pcVar2 = "s";
    if ((long)options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x10) {
      pcVar2 = "";
    }
    if (lVar1 == 1) {
      pcVar3 = "";
    }
    error("GBC palette dump contains %zu 8-byte palette%s, plus %zu byte%s",
          (long)options.palSpec.
                super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)options.palSpec.
                super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4,pcVar2,lVar1,pcVar3);
  }
  return;
}

Assistant:

static void parseGBCFile(std::filebuf &file) {
	// This only needs to be able to read back files generated by `rgbgfx -p`
	options.palSpec.clear();

	for (;;) {
		char buf[2 * 4];
		auto len = file.sgetn(buf, sizeof(buf));
		if (len == 0) {
			break;
		} else if (len != sizeof(buf)) {
			error("GBC palette dump contains %zu 8-byte palette%s, plus %zu byte%s",
			      options.palSpec.size(), options.palSpec.size() == 1 ? "" : "s", len,
			      len == 1 ? "" : "s");
			break;
		}

		options.palSpec.push_back({Rgba::fromCGBColor(readLE<uint16_t>(&buf[0])),
		                           Rgba::fromCGBColor(readLE<uint16_t>(&buf[2])),
		                           Rgba::fromCGBColor(readLE<uint16_t>(&buf[4])),
		                           Rgba::fromCGBColor(readLE<uint16_t>(&buf[6]))});
	}
}